

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_op_t * MIR_new_str_op(MIR_op_t *__return_storage_ptr__,MIR_context_t ctx,MIR_str_t str)

{
  string_t sStack_28;
  
  __return_storage_ptr__->field_0x8 = 9;
  __return_storage_ptr__->data = (void *)0x0;
  string_store(&sStack_28,ctx,&ctx->string_ctx->strings,&ctx->string_ctx->string_tab,str);
  (__return_storage_ptr__->u).i = sStack_28.str.len;
  (__return_storage_ptr__->u).str.s = sStack_28.str.s;
  return __return_storage_ptr__;
}

Assistant:

MIR_op_t MIR_new_str_op (MIR_context_t ctx, MIR_str_t str) {
  MIR_op_t op;

  init_op (&op, MIR_OP_STR);
  op.u.str = get_ctx_string (ctx, str).str;
  return op;
}